

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O2

void asmjit::v1_14::JitAllocatorImpl_insertBlock
               (JitAllocatorPrivateImpl *impl,JitAllocatorBlock *block)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  JitAllocatorPool *pJVar4;
  long lVar5;
  ulong uVar6;
  JitAllocatorPool *pJVar7;
  Compare<(asmjit::v1_14::Support::SortOrder)0> local_11;
  
  pJVar4 = block->_pool;
  if (pJVar4->cursor == (JitAllocatorBlock *)0x0) {
    pJVar4->cursor = block;
  }
  ZoneTree<asmjit::v1_14::JitAllocatorBlock>::
  insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
            (&impl->tree,block,&local_11);
  lVar5 = *(long *)&pJVar4->field_0x8;
  *(long *)&block->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> = lVar5;
  *(JitAllocatorBlock **)&pJVar4->field_0x8 = block;
  pJVar7 = (JitAllocatorPool *)(lVar5 + 0x18);
  if (lVar5 == 0) {
    pJVar7 = pJVar4;
  }
  *(JitAllocatorBlock **)pJVar7 = block;
  uVar2 = block->_flags;
  pJVar4->blockCount = pJVar4->blockCount + 1;
  uVar3 = block->_areaSize;
  uVar6 = (ulong)(uVar2 & 8);
  plVar1 = (long *)((long)pJVar4->totalAreaSize + uVar6);
  *plVar1 = *plVar1 + (ulong)uVar3;
  plVar1 = (long *)((long)pJVar4->totalAreaUsed + uVar6);
  *plVar1 = *plVar1 + (ulong)block->_areaUsed;
  pJVar4->totalOverheadBytes =
       (ulong)(uVar3 + 0x3f >> 2 & 0xfffffff0) + pJVar4->totalOverheadBytes + 0x68;
  return;
}

Assistant:

static void JitAllocatorImpl_insertBlock(JitAllocatorPrivateImpl* impl, JitAllocatorBlock* block) noexcept {
  JitAllocatorPool* pool = block->pool();

  if (!pool->cursor)
    pool->cursor = block;

  // Add to RBTree and List.
  impl->tree.insert(block);
  pool->blocks.append(block);

  // Update statistics.
  size_t statIndex = size_t(block->hasLargePages());
  pool->blockCount++;
  pool->totalAreaSize[statIndex] += block->areaSize();
  pool->totalAreaUsed[statIndex] += block->areaUsed();
  pool->totalOverheadBytes += sizeof(JitAllocatorBlock) + JitAllocatorImpl_bitVectorSizeToByteSize(block->areaSize()) * 2u;
}